

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intsubaddadd_cancel(jit_State *J)

{
  jit_State *J_local;
  
  if (((J->fold).ins.field_1.t.irt & 0x1f) != 0xe) {
    if (((J->fold).left[0].field_1.t.irt & 0x40) != 0) {
      return 0;
    }
    if (((J->fold).right[0].field_1.t.irt & 0x40) != 0) {
      return 0;
    }
    if ((J->fold).left[0].field_0.op1 == (J->fold).right[0].field_0.op1) {
      (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op2;
      (J->fold).ins.field_0.op2 = (J->fold).right[0].field_0.op2;
      return 1;
    }
    if ((J->fold).left[0].field_0.op1 == (J->fold).right[0].field_0.op2) {
      (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op2;
      (J->fold).ins.field_0.op2 = (J->fold).right[0].field_0.op1;
      return 1;
    }
    if ((J->fold).left[0].field_0.op2 == (J->fold).right[0].field_0.op1) {
      (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op1;
      (J->fold).ins.field_0.op2 = (J->fold).right[0].field_0.op2;
      return 1;
    }
    if ((J->fold).left[0].field_0.op2 == (J->fold).right[0].field_0.op2) {
      (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op1;
      (J->fold).ins.field_0.op2 = (J->fold).right[0].field_0.op1;
      return 1;
    }
  }
  return 0;
}

Assistant:

LJFOLD(SUB ADD ADD)
LJFOLDF(simplify_intsubaddadd_cancel)
{
  if (!irt_isnum(fins->t)) {
    PHIBARRIER(fleft);
    PHIBARRIER(fright);
    if (fleft->op1 == fright->op1) {  /* (i + j1) - (i + j2) ==> j1 - j2 */
      fins->op1 = fleft->op2;
      fins->op2 = fright->op2;
      return RETRYFOLD;
    }
    if (fleft->op1 == fright->op2) {  /* (i + j1) - (j2 + i) ==> j1 - j2 */
      fins->op1 = fleft->op2;
      fins->op2 = fright->op1;
      return RETRYFOLD;
    }
    if (fleft->op2 == fright->op1) {  /* (j1 + i) - (i + j2) ==> j1 - j2 */
      fins->op1 = fleft->op1;
      fins->op2 = fright->op2;
      return RETRYFOLD;
    }
    if (fleft->op2 == fright->op2) {  /* (j1 + i) - (j2 + i) ==> j1 - j2 */
      fins->op1 = fleft->op1;
      fins->op2 = fright->op1;
      return RETRYFOLD;
    }
  }
  return NEXTFOLD;
}